

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_spatializer_listener_get_heap_layout
                    (ma_spatializer_listener_config *pConfig,
                    ma_spatializer_listener_heap_layout *pHeapLayout)

{
  long *in_RSI;
  uint *in_RDI;
  ma_result local_14;
  
  if (in_RSI != (long *)0x0) {
    memset(in_RSI,0,0x10);
  }
  if (in_RDI == (uint *)0x0) {
    local_14 = MA_INVALID_ARGS;
  }
  else if (*in_RDI == 0) {
    local_14 = MA_INVALID_ARGS;
  }
  else {
    *in_RSI = 0;
    in_RSI[1] = *in_RSI;
    *in_RSI = ((ulong)*in_RDI + 7 & 0xfffffffffffffff8) + *in_RSI;
    local_14 = MA_SUCCESS;
  }
  return local_14;
}

Assistant:

static ma_result ma_spatializer_listener_get_heap_layout(const ma_spatializer_listener_config* pConfig, ma_spatializer_listener_heap_layout* pHeapLayout)
{
    MA_ASSERT(pHeapLayout != NULL);

    MA_ZERO_OBJECT(pHeapLayout);

    if (pConfig == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pConfig->channelsOut == 0) {
        return MA_INVALID_ARGS;
    }

    pHeapLayout->sizeInBytes = 0;

    /* Channel map. We always need this, even for passthroughs. */
    pHeapLayout->channelMapOutOffset = pHeapLayout->sizeInBytes;
    pHeapLayout->sizeInBytes += ma_align_64(sizeof(*pConfig->pChannelMapOut) * pConfig->channelsOut);

    return MA_SUCCESS;
}